

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

void __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
          (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *this,
          OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *other)

{
  bool bVar1;
  OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *other_local;
  OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *this_local;
  
  OptionalStorage(this);
  bVar1 = hasValue(other);
  if (bVar1) {
    emplace<llvm::DWARFDebugNames::Entry>(this,(Entry *)other);
  }
  return;
}

Assistant:

OptionalStorage(OptionalStorage &&other) : OptionalStorage() {
    if (other.hasValue()) {
      emplace(std::move(other.value));
    }
  }